

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockData.cpp
# Opt level: O2

int __thiscall AGSSock::AGSSockData::Dispose(AGSSockData *this,char *data,bool force)

{
  if (data != (char *)0x0) {
    std::__cxx11::string::~string((string *)data);
  }
  operator_delete(data,0x20);
  return 1;
}

Assistant:

int AGSSockData::Dispose(const char *data, bool force)
{
	delete (SockData *) data;
	return 1;
}